

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreClient.cpp
# Opt level: O1

Enum __thiscall
ViconDataStreamSDK::Core::VClient::GetVideoFrame
          (VClient *this,string *i_rCameraName,VVideoFramePtr *o_rVideoFramePtr)

{
  bool bVar1;
  VCameraInfo *pVVar2;
  Enum EVar3;
  Enum GetResult;
  scoped_lock Lock;
  Enum local_2c;
  unique_lock<boost::recursive_mutex> local_28;
  
  local_28.m = &this->m_FrameMutex;
  local_28.is_locked = false;
  boost::unique_lock<boost::recursive_mutex>::lock(&local_28);
  local_2c = Success;
  bVar1 = InitGet(this,&local_2c);
  if (bVar1) {
    pVVar2 = GetCamera(this,i_rCameraName,&local_2c);
    if (pVVar2 == (VCameraInfo *)0x0) {
      o_rVideoFramePtr = (VVideoFramePtr *)(ulong)local_2c;
    }
    else {
      GetVideoFrame(this,pVVar2->m_CameraID,&local_2c,o_rVideoFramePtr);
    }
    EVar3 = (Enum)o_rVideoFramePtr;
    if (pVVar2 == (VCameraInfo *)0x0) goto LAB_00130996;
  }
  EVar3 = local_2c;
LAB_00130996:
  if (local_28.is_locked == true) {
    boost::recursive_mutex::unlock(local_28.m);
  }
  return EVar3;
}

Assistant:

Result::Enum VClient::GetVideoFrame( const std::string & i_rCameraName, ViconCGStreamClientSDK::VVideoFramePtr & o_rVideoFramePtr ) const
{
  boost::recursive_mutex::scoped_lock Lock( m_FrameMutex );

  Result::Enum GetResult = Result::Success;
  if ( InitGet( GetResult ) )
  {
    const ViconCGStream::VCameraInfo* pCamera = GetCamera( i_rCameraName, GetResult );
    if( !pCamera )
    {
      return GetResult;
    }

    GetVideoFrame( pCamera->m_CameraID, GetResult, o_rVideoFramePtr );
  }

  return GetResult;
}